

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void err_msg<signed_char,short>(string *msg,char t,short u,bool expected)

{
  ostream *poVar1;
  byte in_CL;
  string *in_RDI;
  short in_stack_0000012e;
  string local_60 [48];
  string local_30 [35];
  byte local_d;
  
  local_d = in_CL & 1;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDI);
  to_hex<signed_char>(in_stack_0000012e._1_1_);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<short>(in_stack_0000012e);
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_d & 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, U u, bool expected)
{
	std::cerr << msg << to_hex(t) << ", " << to_hex(u) << ", expected = " << expected << std::endl;
}